

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadManager.hpp
# Opt level: O2

HANDLE __thiscall
Husky::ThreadManager::CreateThread(ThreadManager *this,PThreadFunc pFunc,void *pPara)

{
  int iVar1;
  pthread_t pt;
  pthread_t pStack_18;
  
  iVar1 = pthread_create(&pStack_18,(pthread_attr_t *)0x0,(__start_routine *)pFunc,pPara);
  if (iVar1 == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->m_vecHandle,&pStack_18);
  }
  return iVar1;
}

Assistant:

HANDLE CreateThread( PThreadFunc pFunc,void *pPara)
            {	
                pthread_t pt;
                int nErrorCode=pthread_create(&pt,NULL,pFunc,pPara);
                if(nErrorCode!=0)
                  return nErrorCode;
                m_vecHandle.push_back(pt);	//加入线程列表 为WaitForMultipleObjects准备	
                return nErrorCode;

            }